

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O1

double __thiscall ON_SubDMatrix::TestMatrix(ON_SubDMatrix *this)

{
  double *E2;
  double *LP;
  double *L1;
  double dVar1;
  double *pdVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double *pdVar11;
  double *L2;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  ON_SimpleArray<double> buffer;
  undefined8 local_128;
  int local_f8;
  double local_e8;
  double local_b8;
  double local_88;
  double local_78;
  double local_68;
  double local_58;
  ON_SimpleArray<double> local_48;
  
  if ((((((this->m_S == (double **)0x0) || (this->m_R < 3)) ||
        (bVar3 = ON_SubDSectorType::IsValid(&this->m_sector_type), !bVar3)) ||
       ((uVar7 = this->m_R, uVar6 = ON_SubDSectorType::PointRingCount(&this->m_sector_type),
        uVar7 != uVar6 ||
        (local_b8 = ON_SubDSectorType::SubdominantEigenvalue(&this->m_sector_type), local_b8 <= 0.0)
        ))) || (1.0 <= local_b8)) ||
     (uVar7 = ON_SubDSectorType::SubdominantEigenvalueMulitiplicity(&this->m_sector_type),
     uVar7 == 0)) {
    ON_SubDIncrementErrorCount();
    local_128._0_4_ = 0x9e331dd2;
    local_128._4_4_ = 0xffe5f8bd;
    goto LAB_0062ed67;
  }
  bVar3 = ON_SubDSectorType::IsValid(&this->m_sector_type);
  local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00818f10;
  local_48.m_a = (double *)0x0;
  local_48.m_count = 0;
  local_48.m_capacity = 0;
  uVar10 = (ulong)(this->m_R * 5);
  if (uVar10 != 0) {
    ON_SimpleArray<double>::SetCapacity(&local_48,uVar10);
  }
  pdVar2 = local_48.m_a;
  uVar10 = (ulong)this->m_R;
  E2 = local_48.m_a + uVar10;
  dVar1 = ON_SubDSectorType::GetSubdominantEigenvectors
                    (&this->m_sector_type,local_48.m_a,uVar10,E2,uVar10);
  if ((dVar1 != local_b8) || (NAN(dVar1) || NAN(local_b8))) {
LAB_0062ed50:
    ON_SubDIncrementErrorCount();
LAB_0062f3d5:
    local_128 = -1.23432101234321e+308;
  }
  else {
    LP = E2 + uVar10;
    L1 = LP + uVar10;
    L2 = L1 + uVar10;
    uVar8 = (ulong)this->m_R;
    if (bVar3) {
      uVar6 = ON_SubDSectorType::GetSurfaceEvaluationCoefficients
                        (&this->m_sector_type,LP,uVar8,L1,uVar8,L2,uVar8);
      if (uVar6 == 0) goto LAB_0062ed50;
    }
    else if (uVar8 != 0) {
      uVar9 = 0;
      do {
        LP[uVar9] = 0.0;
        L1[uVar9] = 0.0;
        L2[uVar9] = 0.0;
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    bVar4 = ON_SubDSectorType::IsSmoothSector(&this->m_sector_type);
    if (((bVar4) || (bVar4 = ON_SubDSectorType::IsDartSector(&this->m_sector_type), bVar4)) &&
       (uVar6 = ON_SubDSectorType::FaceCount(&this->m_sector_type), uVar6 == 2)) {
      uVar6 = ON_SubDSectorType::EdgeCount(&this->m_sector_type);
      bVar4 = uVar6 == 2;
    }
    else {
      bVar4 = false;
    }
    bVar5 = ON_SubDSectorType::IsSmoothSector(&this->m_sector_type);
    if (((bVar5) || (bVar5 = ON_SubDSectorType::IsDartSector(&this->m_sector_type), bVar5)) &&
       (uVar6 = ON_SubDSectorType::FaceCount(&this->m_sector_type), uVar6 == 2)) {
      uVar6 = ON_SubDSectorType::EdgeCount(&this->m_sector_type);
      bVar5 = uVar6 == 2;
    }
    else {
      bVar5 = false;
    }
    bVar4 = (bool)(bVar4 | bVar5);
    dVar1 = 0.0;
    dVar17 = 0.0;
    dVar16 = 0.0;
    dVar14 = 0.0;
    pdVar11 = pdVar2;
    for (uVar8 = (ulong)this->m_R; uVar8 != 0; uVar8 = uVar8 - 1) {
      dVar1 = dVar1 + *pdVar11 * *pdVar11;
      dVar17 = dVar17 + pdVar11[uVar10] * pdVar11[uVar10];
      dVar16 = dVar16 + pdVar11[uVar10 * 3] * pdVar11[uVar10 * 3];
      dVar14 = dVar14 + pdVar11[uVar10 * 4] * pdVar11[uVar10 * 4];
      pdVar11 = pdVar11 + 1;
    }
    if (((!(bool)(0.0 < dVar1 | bVar4)) || (dVar17 <= 0.0)) || ((dVar16 <= 0.0 || (dVar14 <= 0.0))))
    {
LAB_0062f3c8:
      ON_SubDIncrementErrorCount();
      goto LAB_0062f3d5;
    }
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    if (dVar17 < 0.0) {
      dVar17 = sqrt(dVar17);
    }
    else {
      dVar17 = SQRT(dVar17);
    }
    if (dVar16 < 0.0) {
      dVar16 = sqrt(dVar16);
    }
    else {
      dVar16 = SQRT(dVar16);
    }
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    if ((((!(bool)(0.0 < dVar1 | bVar4)) || (dVar17 <= 0.0)) || (dVar16 <= 0.0)) ||
       (local_128 = 0.0, dVar14 <= 0.0)) goto LAB_0062f3c8;
    uVar10 = (ulong)this->m_R;
    if (this->m_R == 0) {
      bVar5 = true;
      local_58 = 0.0;
      local_68 = 0.0;
      local_88 = 0.0;
      local_78 = 0.0;
      local_e8 = 0.0;
    }
    else {
      local_b8 = -local_b8;
      uVar8 = 0;
      local_e8 = 0.0;
      local_78 = 0.0;
      local_88 = 0.0;
      local_68 = 0.0;
      local_58 = 0.0;
      local_128 = 0.0;
      do {
        if (LP[uVar8] < 0.0) {
          ON_SubDIncrementErrorCount();
          bVar5 = false;
          goto LAB_0062f438;
        }
        dVar15 = 0.0;
        uVar9 = 0;
        dVar13 = 0.0;
        do {
          dVar13 = dVar13 + pdVar2[uVar9] * this->m_S[uVar8][uVar9];
          dVar15 = dVar15 + this->m_S[uVar8][uVar9] * E2[uVar9];
          uVar9 = uVar9 + 1;
        } while ((int)uVar10 + (uint)((int)uVar10 == 0) != uVar9);
        dVar12 = 0.0;
        if (!bVar4) {
          dVar12 = ABS((pdVar2[uVar8] * local_b8 + dVar13) / dVar1);
        }
        if ((local_128 < 0.0) || (dVar12 < 0.0)) {
          ON_SubDIncrementErrorCount();
        }
        if (dVar12 <= local_128) {
          dVar12 = local_128;
        }
        local_128 = dVar12;
        local_f8 = 8;
        if (0.0 <= local_128) {
          if (uVar7 == 2) {
            dVar13 = (E2[uVar8] * local_b8 + dVar15) / dVar17;
            if (NAN(dVar13)) {
              ON_SubDIncrementErrorCount();
            }
            dVar13 = ABS(dVar13);
            if (dVar13 <= local_128) {
              dVar13 = local_128;
            }
            local_128 = dVar13;
            if (local_128 < 0.0) goto LAB_0062f392;
          }
          if (bVar3) {
            if (this->m_LP != (double *)0x0) {
              dVar13 = this->m_LP[uVar8];
              if ((dVar13 != LP[uVar8]) || (NAN(dVar13) || NAN(LP[uVar8]))) {
                local_f8 = 1;
                ON_SubDIncrementErrorCount();
                goto LAB_0062f392;
              }
            }
            if ((ulong)this->m_R == 0) {
              dVar13 = 0.0;
              dVar15 = 0.0;
            }
            else {
              dVar15 = 0.0;
              uVar10 = 0;
              dVar13 = 0.0;
              do {
                dVar13 = dVar13 + L1[uVar10] * this->m_S[uVar10][uVar8];
                dVar15 = dVar15 + this->m_S[uVar10][uVar8] * L2[uVar10];
                uVar10 = uVar10 + 1;
              } while (this->m_R != uVar10);
            }
            if (bVar5) {
              dVar12 = 0.0;
              if (((int)uVar8 != 2) && (dVar12 = 0.0, (int)uVar8 != 4)) goto LAB_0062f216;
            }
            else {
LAB_0062f216:
              dVar12 = ABS((L1[uVar8] * local_b8 + dVar13) / dVar16);
            }
            if ((local_128 < 0.0) || (dVar12 < 0.0)) {
              ON_SubDIncrementErrorCount();
            }
            if (dVar12 <= local_128) {
              dVar12 = local_128;
            }
            local_128 = dVar12;
            if (0.0 <= local_128) {
              if (uVar7 == 2) {
                dVar13 = (L2[uVar8] * local_b8 + dVar15) / dVar14;
                if (NAN(dVar13)) {
                  ON_SubDIncrementErrorCount();
                }
                dVar13 = ABS(dVar13);
                if (dVar13 <= local_128) {
                  dVar13 = local_128;
                }
                local_128 = dVar13;
                if (local_128 < 0.0) goto LAB_0062f392;
              }
              dVar13 = LP[uVar8];
              local_68 = local_68 + L1[uVar8];
              local_88 = local_88 + L2[uVar8];
              local_58 = local_58 + dVar13;
              local_78 = local_78 + pdVar2[uVar8] * dVar13;
              local_e8 = local_e8 + dVar13 * E2[uVar8];
              local_f8 = 0;
            }
          }
          else {
            local_f8 = 10;
          }
        }
LAB_0062f392:
        if ((local_f8 != 10) && (local_f8 != 0)) goto LAB_0062f432;
        uVar8 = uVar8 + 1;
        uVar10 = (ulong)this->m_R;
      } while (uVar8 < uVar10);
      local_f8 = 8;
LAB_0062f432:
      bVar5 = local_f8 == 8;
    }
LAB_0062f438:
    if (!bVar5) goto LAB_0062f3d5;
    if (bVar3) {
      dVar13 = local_128;
      if (0.0 <= local_128) {
        if (NAN(1.0 - local_58)) {
          ON_SubDIncrementErrorCount();
        }
        dVar13 = ABS(1.0 - local_58);
        if (dVar13 <= local_128) {
          dVar13 = local_128;
        }
        local_128 = 0.0;
        if (0.0 <= dVar13) {
          if (!bVar4) {
            local_128 = ABS(local_78) / dVar1;
            if (local_128 < 0.0) {
              ON_SubDIncrementErrorCount();
            }
            if (local_128 <= dVar13) {
              local_128 = dVar13;
            }
          }
          dVar13 = local_128;
          if (0.0 <= local_128) {
            dVar13 = ABS(local_e8) / dVar17;
            if (dVar13 < 0.0) {
              ON_SubDIncrementErrorCount();
            }
            if (dVar13 <= local_128) {
              dVar13 = local_128;
            }
            if (0.0 <= dVar13) {
              dVar16 = ABS(local_68) / dVar16;
              if (dVar16 < 0.0) {
                ON_SubDIncrementErrorCount();
              }
              if (dVar16 <= dVar13) {
                dVar16 = dVar13;
              }
              dVar13 = dVar16;
              if (0.0 <= dVar16) {
                dVar13 = ABS(local_88) / dVar14;
                if (dVar13 < 0.0) {
                  ON_SubDIncrementErrorCount();
                }
                if (dVar13 <= dVar16) {
                  dVar13 = dVar16;
                }
              }
            }
          }
        }
      }
      local_128 = dVar13;
      dVar1 = ON_SubDSectorType::SurfaceNormalSign(&this->m_sector_type);
      if (0.0 < dVar1) goto LAB_0062f52f;
      ON_SubDIncrementErrorCount();
      local_128 = -1.23432101234321e+308;
    }
    else {
LAB_0062f52f:
      if (local_128 < 0.0) {
        ON_SubDIncrementErrorCount();
        local_128 = -1.23432101234321e+308;
      }
    }
  }
  ON_SimpleArray<double>::~ON_SimpleArray(&local_48);
LAB_0062ed67:
  return (double)CONCAT44(local_128._4_4_,(undefined4)local_128);
}

Assistant:

double ON_SubDMatrix::TestMatrix() const
{
  if (nullptr == m_S || m_R < 3)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  if ( false == m_sector_type.IsValid() )
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  if (m_R != m_sector_type.PointRingCount())
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const double lambda = m_sector_type.SubdominantEigenvalue();
  if (!(lambda > 0.0 && lambda < 1.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const unsigned int lambda_multiplicity = m_sector_type.SubdominantEigenvalueMulitiplicity();
  if ( lambda_multiplicity <= 0 )
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  double rc = 0.0;


  const bool bTestLimitEvaluation = m_sector_type.SurfaceEvaluationCoefficientsAvailable();

  // Eigen information test
  ON_SimpleArray<double> buffer;
  double* E1 = buffer.Reserve(5*m_R);
  double* E2 = E1 + m_R;
  double* LP = E2 + m_R;
  double* L1 = LP + m_R;
  double* L2 = L1 + m_R;
  double d = m_sector_type.GetSubdominantEigenvectors(E1, m_R, E2, m_R);
  if (!(d == lambda))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  if (bTestLimitEvaluation)
  {
    if (!m_sector_type.GetSurfaceEvaluationCoefficients(LP, m_R, L1, m_R, L2, m_R))
      return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  }
  else
  {
    for (unsigned int i = 0; i < m_R; i++)
    {
      LP[i] = 0.0;
      L1[i] = 0.0;
      L2[i] = 0.0;
    }
  }

  // A smooth sector with 2 faces is degenerate and does not have nice eigenvalues and eigenvectors
  // that give a well defined surface normal. In this case we use a heuristic for the normal.
  // When bSmoothTwoFaceCase E1 = {0,0,0,0,0}, lengthE1 = 0, lengthE1 = 0.
  const bool bSmoothTwoFaceCase
    = (m_sector_type.IsSmoothSector() || m_sector_type.IsDartSector())
    && 2u == m_sector_type.FaceCount()
    && 2u == m_sector_type.EdgeCount()
    ;
  const bool bDartTwoFaceCase
    = (m_sector_type.IsSmoothSector() || m_sector_type.IsDartSector())
    && 2u == m_sector_type.FaceCount()
    && 2u == m_sector_type.EdgeCount()
    ;
  const bool bSmoothOrDartTwoFaceCase = bSmoothTwoFaceCase || bDartTwoFaceCase;

  double lengthE1 = 0.0;
  double lengthE2 = 0.0;
  double lengthL1 = 0.0;
  double lengthL2 = 0.0;
  for (unsigned int i = 0; i < m_R; i++)
  {
    lengthE1 += E1[i] * E1[i];
    lengthE2 += E2[i] * E2[i];
    lengthL1 += L1[i] * L1[i];
    lengthL2 += L2[i] * L2[i];
  }
  if (false == bSmoothOrDartTwoFaceCase && !(lengthE1 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthE2 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthL1 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthL2 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  lengthE1 = sqrt(lengthE1);
  lengthE2 = sqrt(lengthE2);
  lengthL1 = sqrt(lengthL1);
  lengthL2 = sqrt(lengthL2);
  if (false == bSmoothOrDartTwoFaceCase && !(lengthE1 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthE2 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthL1 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (!(lengthL2 > 0.0))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  
  double LPsum = 0.0;
  double L1sum = 0.0;
  double L2sum = 0.0;
  double E1oLP = 0.0;
  double E2oLP = 0.0;
  for (unsigned int i = 0; i < m_R; i++)
  {
    if (!(LP[i] >= 0.0))
      return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

    const double* Si = m_S[i];
    double x1 = 0.0;
    double x2 = 0.0;
    for (unsigned int j = 0; j < m_R; j++)
    {
      // E1, E2 should be eigenvectors of S with eigenvalue lambda
      x1 += Si[j] * E1[j];
      x2 += Si[j] * E2[j];
    }
    d = bSmoothOrDartTwoFaceCase ? 0.0 : fabs((x1 - lambda*E1[i])/lengthE1);
    rc = TestMatrixReturnValue(d,rc);
    if (!(rc >= 0.0))
      break;

    if (2 == lambda_multiplicity)
    {
      d = fabs((x2 - lambda*E2[i])/lengthE2);
      rc = TestMatrixReturnValue(d, rc);
      if (!(rc >= 0.0))
        break;
    }

    if ( false == bTestLimitEvaluation )
      continue;

    if (nullptr != m_LP)
    {
      if ( !(m_LP[i] == LP[i]) )
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
    }

    double y1 = 0.0;
    double y2 = 0.0;
    for (unsigned int j = 0; j < m_R; j++)
    {
      // L1, L2 should be eigenvectors of Transpose(S) with eigenvalue lambda
      y1 += m_S[j][i] * L1[j];
      y2 += m_S[j][i] * L2[j];
    }

    d = (bDartTwoFaceCase && (2u == i || 4u == i)) ? 0.0 : fabs((y1 - lambda*L1[i])/lengthL1);
    rc = TestMatrixReturnValue(d,rc);
    if (!(rc >= 0.0))
      break;

    if (2 == lambda_multiplicity)
    {
      d = fabs((y2 - lambda*L2[i])/lengthL2);
      rc = TestMatrixReturnValue(d, rc);
      if (!(rc >= 0.0))
        break;
    }


    LPsum += LP[i];
    L1sum += L1[i];
    L2sum += L2[i];

    E1oLP += E1[i] * LP[i];
    E2oLP += E2[i] * LP[i];
  }
    
  if (bTestLimitEvaluation)
  {
    while (rc >= 0.0)
    {
      // LP coefficients should sum to 1
      rc = TestMatrixReturnValue(fabs(1.0 - LPsum), rc);
      if (!(rc >= 0.0))
        break;

      // E1 and E2 should be orthogonal to LP which means
      // E0oLP and E1oLP should be zero
      //
      // Why?
      //   Set T = Transpose(S).
      //   T*LP = LP (LP is an eigenvector or T with eigenvalue = 1)
      //   S*E = lambda*E (E is an eigenvector of S with eigenvalue lambda != 1)
      //   LP o E1
      //    = Transpose(LP) * E
      //    = Transpose( T*LP ) * E
      //    = Transpose(LP) * Transpose(T) * E
      //    = Transpose(LP) * S * E
      //    = Transpose(LP) * (lambda E)
      //    = lambda * (Transpose(LP) * E )
      //    = lambda * LPoE
      //   If LPoE != 0, then lambda = 1, which is not the case.
      rc = bSmoothOrDartTwoFaceCase ? 0.0 : TestMatrixReturnValue(fabs(E1oLP) / lengthE1, rc);
      if (!(rc >= 0.0))
        break;
      rc = TestMatrixReturnValue(fabs(E2oLP) / lengthE2, rc);
      if (!(rc >= 0.0))
        break;

      // L1 and L2 should be orthogonal to (1,1,...,1) which means
      // L1 L2 coefficients should sum to zero.
      rc = TestMatrixReturnValue(fabs(L1sum) / lengthL1, rc);
      if (!(rc >= 0.0))
        break;
      rc = TestMatrixReturnValue(fabs(L2sum) / lengthL2, rc);
      if (!(rc >= 0.0))
        break;

      break;
    }

    // See if L1 and L2 can produce a reasonable normal in the simplest possible case
    double z = m_sector_type.SurfaceNormalSign();
    if (!(z > 0.0))
      return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  }

  if (rc >= 0.0)
    return rc;

  return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE); 
}